

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourcePositional::IfcLightSourcePositional
          (IfcLightSourcePositional *this,void **vtt)

{
  void *pvVar1;
  _func_int **pp_Var2;
  
  IfcLightSource::IfcLightSource(&this->super_IfcLightSource,vtt + 1);
  pvVar1 = vtt[0x10];
  *(void **)&(this->super_IfcLightSource).field_0x80 = pvVar1;
  *(void **)(&(this->super_IfcLightSource).field_0x80 + *(long *)((long)pvVar1 + -0x18)) = vtt[0x11]
  ;
  *(undefined8 *)&(this->super_IfcLightSource).field_0x88 = 0;
  pp_Var2 = (_func_int **)*vtt;
  (this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       pp_Var2;
  *(void **)((long)&(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.
                    super_IfcRepresentationItem.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                    _vptr_ObjectHelper + (long)pp_Var2[-3]) = vtt[0x12];
  *(void **)&(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       vtt[0x13];
  *(void **)&(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.
             super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       vtt[0x14];
  *(void **)&(this->super_IfcLightSource).field_0x80 = vtt[0x15];
  *(undefined8 *)&(this->super_IfcLightSource).field_0x90 = 0;
  return;
}

Assistant:

IfcLightSourcePositional() : Object("IfcLightSourcePositional") {}